

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressionSize.c
# Opt level: O3

int DoCompressionTest(IceTEnum color_format,IceTEnum depth_format,IceTEnum composite_mode)

{
  undefined1 auVar1 [16];
  IceTSizeType IVar2;
  IceTSizeType IVar3;
  uint uVar4;
  uint uVar5;
  IceTEnum IVar6;
  int iVar7;
  IceTSizeType IVar8;
  void *buffer;
  IceTImage image;
  void *buffer_00;
  IceTSparseImage compressed_image;
  void *buffer_01;
  IceTSparseImage out_image;
  IceTUByte *pIVar9;
  IceTFloat *pIVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  IceTUByte IVar14;
  uint uVar15;
  int iVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  IceTSizeType depth_pixel_size;
  IceTSizeType color_pixel_size;
  IceTInt viewport [4];
  int local_50;
  int local_4c;
  IceTInt local_48 [2];
  IceTSizeType local_40;
  IceTSizeType local_3c;
  long lVar20;
  
  printf("Using color format of 0x%x\n",(ulong)color_format);
  printf("Using depth format of 0x%x\n",depth_format);
  printf("Using composite mode of 0x%x\n",(ulong)composite_mode);
  icetSetColorFormat(color_format);
  icetSetDepthFormat(depth_format);
  icetCompositeMode(composite_mode);
  IVar2 = SCREEN_HEIGHT;
  IVar8 = SCREEN_WIDTH;
  printf("Allocating memory for %dx%d pixel image.\n",(ulong)(uint)SCREEN_WIDTH);
  IVar3 = icetImageBufferSize(SCREEN_WIDTH,SCREEN_HEIGHT);
  buffer = malloc((long)IVar3);
  image = icetImageAssignBuffer(buffer,SCREEN_WIDTH,SCREEN_HEIGHT);
  uVar4 = icetSparseImageBufferSize(SCREEN_WIDTH,SCREEN_HEIGHT);
  buffer_00 = malloc((long)(int)uVar4);
  compressed_image = icetSparseImageAssignBuffer(buffer_00,SCREEN_WIDTH,SCREEN_HEIGHT);
  buffer_01 = malloc((long)(int)uVar4);
  out_image = icetSparseImageAssignBuffer(buffer_01,SCREEN_WIDTH,SCREEN_HEIGHT);
  icetImageGetColorVoid(image,&local_4c);
  icetImageGetDepthVoid(image,&local_50);
  iVar11 = local_50 + local_4c;
  printf("Pixel size: color=%d, depth=%d, total=%d\n");
  puts("\nCreating worst possible image (with respect to compression).");
  uVar5 = icetImageGetNumPixels(image);
  IVar6 = icetImageGetColorFormat(image);
  if (IVar6 != 0xc000) {
    if (IVar6 == 0xc002) {
      pIVar10 = icetImageGetColorf(image);
      if (0 < (int)uVar5) {
        uVar13 = 0;
        do {
          fVar17 = (float)((uint)uVar13 & 1);
          *pIVar10 = (IceTFloat)fVar17;
          pIVar10[1] = (IceTFloat)fVar17;
          pIVar10[2] = (IceTFloat)fVar17;
          pIVar10[3] = (IceTFloat)fVar17;
          uVar13 = uVar13 + 1;
          pIVar10 = pIVar10 + 4;
        } while (uVar5 != uVar13);
      }
    }
    else if (IVar6 == 0xc001) {
      pIVar9 = icetImageGetColorub(image);
      if (0 < (int)uVar5) {
        uVar13 = 0;
        do {
          IVar14 = -((byte)uVar13 & 1);
          pIVar9[uVar13 * 4] = IVar14;
          pIVar9[uVar13 * 4 + 1] = IVar14;
          pIVar9[uVar13 * 4 + 2] = IVar14;
          pIVar9[uVar13 * 4 + 3] = IVar14;
          uVar13 = uVar13 + 1;
        } while (uVar5 != uVar13);
      }
    }
    else {
      puts("*** Unknown color format? ***");
    }
  }
  IVar6 = icetImageGetDepthFormat(image);
  if (IVar6 != 0xd000) {
    if (IVar6 == 0xd001) {
      pIVar10 = icetImageGetDepthf(image);
      auVar1 = _DAT_0011c1f0;
      if (0 < (int)uVar5) {
        lVar12 = (ulong)uVar5 - 1;
        auVar18._8_4_ = (int)lVar12;
        auVar18._0_8_ = lVar12;
        auVar18._12_4_ = (int)((ulong)lVar12 >> 0x20);
        lVar12 = 0;
        auVar18 = auVar18 ^ _DAT_0011c1f0;
        auVar19 = _DAT_0011c1e0;
        do {
          auVar21 = auVar19 ^ auVar1;
          if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                      auVar18._4_4_ < auVar21._4_4_) & 1)) {
            *(undefined4 *)((long)pIVar10 + lVar12) = 0;
          }
          if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
              auVar21._12_4_ <= auVar18._12_4_) {
            *(undefined4 *)((long)pIVar10 + lVar12 + 4) = 0x3f800000;
          }
          lVar20 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 2;
          auVar19._8_8_ = lVar20 + 2;
          lVar12 = lVar12 + 8;
        } while ((ulong)(uVar5 + 1 >> 1) << 3 != lVar12);
      }
    }
    else {
      puts("*** Unknown depth format? ***");
    }
  }
  puts("Compressing image.");
  icetCompressImage(image,compressed_image);
  uVar5 = icetSparseImageGetCompressedBufferSize(compressed_image);
  iVar7 = (IVar2 * IVar8) / 2;
  iVar16 = iVar11 * iVar7;
  uVar15 = (iVar11 + 4) * iVar7;
  iVar7 = 0;
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar15,(ulong)uVar5);
  if (((int)uVar4 < (int)uVar5) || ((int)uVar5 < iVar16)) {
    puts("*** Size differs from expected size!");
    iVar7 = -3;
  }
  puts("Interlacing image.");
  icetSparseImageInterlace(compressed_image,0x61,0x1b0,out_image);
  uVar5 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar15,(ulong)uVar5);
  if (((int)uVar4 < (int)uVar5) || ((int)uVar5 < iVar16)) {
    puts("*** Size differs from expected size!");
    iVar7 = -3;
  }
  puts("\nCreating a different worst possible image.");
  InitActiveImage(image);
  puts("Compressing image.");
  icetCompressImage(image,compressed_image);
  uVar5 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar4,(ulong)uVar5);
  iVar11 = iVar11 * IVar2 * IVar8;
  if (((int)uVar4 < (int)uVar5) || ((int)uVar5 < iVar11)) {
    puts("*** Size differs from expected size!");
    iVar7 = -3;
  }
  puts("Interlacing image.");
  icetSparseImageInterlace(compressed_image,0x61,0x1b0,out_image);
  uVar5 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar15,(ulong)uVar5);
  if (((int)uVar4 < (int)uVar5) || ((int)uVar5 < iVar16)) {
    puts("*** Size differs from expected size!");
    iVar7 = -3;
  }
  puts("\nCompressing zero size image.");
  icetImageSetDimensions(image,0,0);
  icetCompressImage(image,compressed_image);
  uVar5 = icetSparseImageGetCompressedBufferSize(compressed_image);
  uVar15 = icetSparseImageBufferSize(0,0);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar15,(ulong)uVar5);
  IVar8 = icetSparseImageBufferSize(0,0);
  if (IVar8 < (int)uVar5) {
    puts("*** Size differs from expected size!");
    iVar7 = -3;
  }
  puts("\nSetup for actual render.");
  icetResetTiles();
  icetAddTile(0,0,SCREEN_WIDTH,SCREEN_HEIGHT,0);
  icetDrawCallback(drawCallback);
  icetDrawFrame(IdentityMatrix,IdentityMatrix,Black);
  local_48[0] = 0;
  local_48[1] = 0;
  local_40 = SCREEN_WIDTH;
  local_3c = SCREEN_HEIGHT;
  icetStateSetIntegerv(0x83,4,local_48);
  puts("Now render and get compressed image.");
  icetGetCompressedTileImage(0,compressed_image);
  uVar5 = icetSparseImageGetCompressedBufferSize(compressed_image);
  printf("Expected size: %d.  Actual size: %d\n",(ulong)uVar4,(ulong)uVar5);
  if (((int)uVar4 < (int)uVar5) || ((int)uVar5 < iVar11)) {
    puts("*** Size differs from expected size!");
    iVar7 = -3;
  }
  puts("Cleaning up.");
  free(buffer);
  free(buffer_00);
  free(buffer_01);
  return iVar7;
}

Assistant:

static int DoCompressionTest(IceTEnum color_format, IceTEnum depth_format,
                             IceTEnum composite_mode)
{
    IceTInt viewport[4];
    IceTSizeType pixels;
    IceTImage image;
    IceTVoid *imagebuffer;
    IceTSizeType imagesize;
    IceTSparseImage compressedimage;
    IceTVoid *compressedbuffer;
    IceTSparseImage interlacedimage;
    IceTVoid *interlacedbuffer;
    IceTSizeType compressedsize;
    IceTSizeType color_pixel_size;
    IceTSizeType depth_pixel_size;
    IceTSizeType pixel_size;
    IceTSizeType size;
    int result;

    result = TEST_PASSED;

    printf("Using color format of 0x%x\n", (int)color_format);
    printf("Using depth format of 0x%x\n", (int)depth_format);
    printf("Using composite mode of 0x%x\n", (int)composite_mode);

    icetSetColorFormat(color_format);
    icetSetDepthFormat(depth_format);
    icetCompositeMode(composite_mode);

    pixels = SCREEN_WIDTH*SCREEN_HEIGHT;

    printf("Allocating memory for %dx%d pixel image.\n",
           (int)SCREEN_WIDTH, (int)SCREEN_HEIGHT);
    imagesize = icetImageBufferSize(SCREEN_WIDTH, SCREEN_HEIGHT);
    imagebuffer = malloc(imagesize);
    image = icetImageAssignBuffer(imagebuffer, SCREEN_WIDTH, SCREEN_HEIGHT);

    compressedsize = icetSparseImageBufferSize(SCREEN_WIDTH, SCREEN_HEIGHT);
    compressedbuffer = malloc(compressedsize);
    compressedimage = icetSparseImageAssignBuffer(compressedbuffer,
                                                  SCREEN_WIDTH,
                                                  SCREEN_HEIGHT);

    interlacedbuffer = malloc(compressedsize);
    interlacedimage = icetSparseImageAssignBuffer(interlacedbuffer,
                                                  SCREEN_WIDTH,
                                                  SCREEN_HEIGHT);

  /* Get the number of bytes per pixel.  This is used in checking the
     size of compressed images. */
    icetImageGetColorVoid(image, &color_pixel_size);
    icetImageGetDepthVoid(image, &depth_pixel_size);
    pixel_size = color_pixel_size + depth_pixel_size;
    printf("Pixel size: color=%d, depth=%d, total=%d\n",
           (int)color_pixel_size, (int)depth_pixel_size, (int)pixel_size);

    printf("\nCreating worst possible image (with respect to compression).\n");
    InitPathologicalImage(image);

    printf("Compressing image.\n");
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Interlacing image.\n");
    icetSparseImageInterlace(compressedimage,
                             97,
                             ICET_SI_STRATEGY_BUFFER_0,
                             interlacedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("\nCreating a different worst possible image.\n");
    InitActiveImage(image);
    printf("Compressing image.\n");
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)compressedsize, (int)size);
    if ((size > compressedsize) || (size < pixel_size*pixels)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Interlacing image.\n");
    icetSparseImageInterlace(compressedimage,
                             97,
                             ICET_SI_STRATEGY_BUFFER_0,
                             interlacedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)(pixel_size*(pixels/2) + 2*sizeof(IceTUShort)*(pixels/2)),
           (int)size);
    if (   (size > compressedsize)
        || (size < pixel_size*(pixels/2)) ) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("\nCompressing zero size image.\n");
    icetImageSetDimensions(image, 0, 0);
    icetCompressImage(image, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)icetSparseImageBufferSize(0, 0), (int)size);
    if (size > icetSparseImageBufferSize(0, 0)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

  /* This test can be a little volatile.  The icetGetCompressedTileImage
   * expects certain things to be set correctly by the icetDrawFrame
   * function.  Since we want to call icetGetCompressedTileImage directly,
   * we try to set up these parameters by hand.  It is possible for this
   * test to incorrectly fail if the two functions are mutually changed and
   * this scaffolding is not updated correctly. */
    printf("\nSetup for actual render.\n");
    icetResetTiles();
    icetAddTile(0, 0, SCREEN_WIDTH, SCREEN_HEIGHT, 0);
    icetDrawCallback(drawCallback);
  /* Do a perfunctory draw to set other state variables. */
    icetDrawFrame(IdentityMatrix, IdentityMatrix, Black);
    viewport[0] = viewport[1] = 0;
    viewport[2] = (IceTInt)SCREEN_WIDTH;  viewport[3] = (IceTInt)SCREEN_HEIGHT;
    icetStateSetIntegerv(ICET_CONTAINED_VIEWPORT, 4, viewport);
    printf("Now render and get compressed image.\n");
    icetGetCompressedTileImage(0, compressedimage);
    size = icetSparseImageGetCompressedBufferSize(compressedimage);
    printf("Expected size: %d.  Actual size: %d\n",
           (int)compressedsize, (int)size);
    if ((size > compressedsize) || (size < pixel_size*pixels)) {
        printf("*** Size differs from expected size!\n");
        result = TEST_FAILED;
    }

    printf("Cleaning up.\n");
    free(imagebuffer);
    free(compressedbuffer);
    free(interlacedbuffer);
    return result;
}